

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenpool_test.cc
# Opt level: O2

void __thiscall
RegisterTokenPoolTestImplicitToken::RegisterTokenPoolTestImplicitToken
          (RegisterTokenPoolTestImplicitToken *this)

{
  RegisterTest(TokenPoolTestImplicitToken::Create,"TokenPoolTest.ImplicitToken");
  return;
}

Assistant:

TEST_F(TokenPoolTest, ImplicitToken) {
  CreateDefaultPool();

  ASSERT_NE(NULL, tokens_);
  EXPECT_EQ(kLoadAverageDefault, load_avg_);

  EXPECT_TRUE(tokens_->Acquire());
  tokens_->Reserve();
  EXPECT_FALSE(tokens_->Acquire());
  tokens_->Release();
  EXPECT_TRUE(tokens_->Acquire());
}